

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void OpenSteer::checkForDrawError(char *locationDescription)

{
  GLenum GVar1;
  ostream *poVar2;
  size_t sVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  
  GVar1 = (*glad_glGetError)();
  if (GVar1 == 0) {
    return;
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"OpenSteerDemo: OpenGL error ",0x1c);
  switch(GVar1) {
  case 0x500:
    pcVar6 = "GL_INVALID_ENUM";
    lVar5 = 0xf;
    break;
  case 0x501:
    pcVar6 = "GL_INVALID_VALUE";
    goto LAB_0011908f;
  case 0x502:
    pcVar6 = "GL_INVALID_OPERATION";
    lVar5 = 0x14;
    break;
  case 0x503:
    pcVar6 = "GL_STACK_OVERFLOW";
    lVar5 = 0x11;
    break;
  case 0x504:
    pcVar6 = "GL_STACK_UNDERFLOW";
    lVar5 = 0x12;
    break;
  case 0x505:
    pcVar6 = "GL_OUT_OF_MEMORY";
LAB_0011908f:
    lVar5 = 0x10;
    break;
  default:
    goto switchD_00119015_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
switchD_00119015_default:
  if (locationDescription != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    sVar3 = strlen(locationDescription);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,locationDescription,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void 
OpenSteer::checkForDrawError (const char * locationDescription)
{
    checkForGLError (locationDescription);
}